

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

operand_immediate_type assembler::anon_unknown_0::get_operand_immediate_type(operation *op)

{
  operand_immediate_type oVar1;
  
  oVar1 = _32BIT;
  switch(*op) {
  case JMP:
  case JA:
  case JB:
  case JE:
  case JL:
  case JLE:
  case JG:
  case JGE:
  case JNE:
    break;
  case JMPS:
  case JAS:
  case JBS:
  case JES:
  case JLS:
  case JLES:
  case JGS:
  case JGES:
  case JNES:
    oVar1 = _8BIT;
    break;
  default:
    if (*op != CALL) {
      return _VARIABLE;
    }
  }
  return oVar1;
}

Assistant:

operand_immediate_type get_operand_immediate_type(const asmcode::operation& op)
    {
    switch (op)
      {
      case asmcode::CALL: return _32BIT;
      case asmcode::JE: return _32BIT;
      case asmcode::JL: return _32BIT;
      case asmcode::JLE:return _32BIT;
      case asmcode::JA: return _32BIT;
      case asmcode::JB: return _32BIT;
      case asmcode::JG: return _32BIT;
      case asmcode::JGE:return _32BIT;
      case asmcode::JNE:return _32BIT;
      case asmcode::JMP:return _32BIT;
      case asmcode::JES: return _8BIT;
      case asmcode::JLS: return _8BIT;
      case asmcode::JLES: return _8BIT;
      case asmcode::JAS: return _8BIT;
      case asmcode::JBS: return _8BIT;
      case asmcode::JGS: return _8BIT;
      case asmcode::JGES: return _8BIT;
      case asmcode::JNES: return _8BIT;
      case asmcode::JMPS: return _8BIT;
      default: return _VARIABLE;
      }
    }